

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O1

void * density::detail::
       LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
       ::get_element(LfQueueControl *i_control,bool i_is_external)

{
  ulong uVar1;
  void *pvVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,i_is_external) == 0) {
    uVar1 = *(ulong *)i_control[1].m_next;
    if ((uVar1 & uVar1 - 1) != 0) {
      density_tests::detail::assert_failed<>
                ("is_power_of_2(i_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                 ,0x10a);
    }
    pvVar2 = (void *)(-uVar1 & (long)&i_control[1].m_next + uVar1 + 7);
  }
  else {
    pvVar2 = (void *)i_control[2].m_next;
  }
  return pvVar2;
}

Assistant:

static void * get_element(detail::LfQueueControl * i_control, bool i_is_external)
            {
                auto result = address_add(i_control, s_element_min_offset);
                if (i_is_external)
                {
                    /* i_control and s_element_min_offset are aligned to
                       alignof(ExternalBlock), so we don't need to align further */
                    result = static_cast<ExternalBlock *>(result)->m_block;
                }
                else
                {
                    result =
                      address_upper_align(result, type_after_control(i_control)->alignment());
                }
                return result;
            }